

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_dist.hpp
# Opt level: O3

int __thiscall trng::discrete_dist::operator()(discrete_dist *this,lcg64 *r)

{
  double dVar1;
  ulong uVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  if ((this->P).N_ == 0) {
    return -1;
  }
  uVar5 = (r->S).r * (r->P).a + (r->P).b;
  (r->S).r = uVar5;
  uVar2 = (this->P).offset_;
  if (uVar2 == 0) {
    uVar6 = 0;
  }
  else {
    pdVar3 = (this->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    dVar7 = (double)(uVar5 >> 1) * 1.0842021724855042e-19 * *pdVar3;
    do {
      dVar1 = pdVar3[uVar6 * 2 + 1];
      dVar8 = dVar7;
      if (dVar1 <= dVar7) {
        dVar8 = dVar7 - dVar1;
      }
      lVar4 = uVar6 * 2;
      uVar6 = uVar6 * 2 + 2;
      if (dVar7 < dVar1) {
        uVar6 = lVar4 + 1;
      }
      dVar7 = dVar8;
    } while (uVar6 < uVar2);
  }
  return (int)uVar6 - (int)uVar2;
}

Assistant:

int operator()(R &r) {
      if (P.N_ == 0)
        return -1;
      double u(utility::uniformco<double>(r) * P.P_[0]);
      param_type::size_type x{0};
      while (x < P.offset_) {
        if (u < P.P_[2 * x + 1]) {
          x = 2 * x + 1;
        } else {
          u -= P.P_[2 * x + 1];
          x = 2 * x + 2;
        }
      }
      return static_cast<int>(x - P.offset_);
    }